

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O3

double logb(double __x)

{
  int extraout_EAX;
  int iVar1;
  ExactFloat *in_RSI;
  ExactFloat *in_RDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar2;
  
  iVar1 = in_RSI->bn_exp_;
  if (iVar1 == 0x7fffffff) {
    ExactFloat::ExactFloat(in_RDI,in_RSI);
    dVar2 = extraout_XMM0_Qa_00;
  }
  else {
    if (iVar1 == 0x7ffffffe) {
      iVar1 = 1;
    }
    else {
      if (iVar1 != 0x7ffffffd) {
        ExactFloat::exp(in_RSI,__x);
        ExactFloat::ExactFloat(in_RDI,extraout_EAX + -1);
        return extraout_XMM0_Qa_01;
      }
      iVar1 = -1;
    }
    ExactFloat::Infinity(in_RDI,iVar1);
    dVar2 = extraout_XMM0_Qa;
  }
  return dVar2;
}

Assistant:

ExactFloat logb(const ExactFloat& a) {
  if (a.is_zero()) return ExactFloat::Infinity(-1);
  if (a.is_inf()) return ExactFloat::Infinity(+1);  // Even if a < 0.
  if (a.is_nan()) return a;
  // exp() assumes the significand is in the range [0.5,1).
  return ExactFloat(a.exp() - 1);
}